

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalarN(char *label,ImGuiDataType data_type,void *v,int components,float v_speed,
                       void *v_min,void *v_max,char *format,float power)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  int in_ECX;
  int in_ESI;
  char *in_RDI;
  int i;
  size_t type_size;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *in_stack_000000a8;
  char *in_stack_000000b0;
  float in_stack_000000f4;
  char *in_stack_000000f8;
  void *in_stack_00000100;
  void *in_stack_00000108;
  float in_stack_00000114;
  void *in_stack_00000118;
  ImGuiDataType in_stack_00000124;
  char *in_stack_00000128;
  undefined8 in_stack_ffffffffffffff90;
  int local_64;
  char *in_stack_ffffffffffffffa0;
  size_t sVar3;
  bool local_1;
  
  pIVar2 = GetCurrentWindow();
  if ((pIVar2->SkipItems & 1U) == 0) {
    local_1 = false;
    BeginGroup();
    PushID(in_stack_ffffffffffffffa0);
    PushMultiItemsWidths
              ((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),SUB84(in_stack_ffffffffffffffa0,0));
    sVar3 = GDataTypeInfo[in_ESI].Size;
    for (local_64 = 0; local_64 < in_ECX; local_64 = local_64 + 1) {
      PushID((int)(sVar3 >> 0x20));
      bVar1 = DragScalar(in_stack_00000128,in_stack_00000124,in_stack_00000118,in_stack_00000114,
                         in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
      local_1 = local_1 != false || bVar1;
      SameLine((float)((ulong)in_stack_ffffffffffffff90 >> 0x20),(float)in_stack_ffffffffffffff90);
      PopID();
      PopItemWidth();
    }
    PopID();
    FindRenderedTextEnd(in_RDI,(char *)0x0);
    TextUnformatted(in_stack_000000b0,in_stack_000000a8);
    EndGroup();
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DragScalarN(const char* label, ImGuiDataType data_type, void* v, int components, float v_speed, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= DragScalar("##v", data_type, v, v_speed, v_min, v_max, format, power);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
        v = (void*)((char*)v + type_size);
    }
    PopID();

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();
    return value_changed;
}